

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_VALUE_ARGS(State *state,Instruction *instr)

{
  reference this;
  Object *this_00;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  uint local_48;
  uint local_44;
  uint sz;
  uint i;
  Array *a;
  Instruction *local_18;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  if (instr->comp_type == '\x02') {
    local_18 = instr;
    instr_local = (Instruction *)state;
    Memory::Create((Memory *)&stack0xffffffffffffffd8,(Type *)state->memory);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&state->op_lifo,(value_type *)&stack0xffffffffffffffd8);
    Variable::~Variable((Variable *)&stack0xffffffffffffffd8);
    this = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                     ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                      (instr_local + 9));
    this_00 = Variable::operator->(this);
    _sz = Object::GetData<LiteScript::Array>(this_00);
    local_44 = (local_18->comp_value).v_integer;
    local_48 = State::GetArgsCount((State *)instr_local);
    for (; local_44 < local_48; local_44 = local_44 + 1) {
      State::GetArg((State *)local_68,(uint)instr_local);
      Array::operator[]((Array *)local_78,(uint)_sz);
      Variable::operator=((Variable *)(local_68 + 0x10),(Variable *)local_78);
      Variable::~Variable((Variable *)(local_68 + 0x10));
      Variable::~Variable((Variable *)local_78);
      Variable::~Variable((Variable *)local_68);
    }
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_ARGS(State& state, Instruction& instr) {
    state.line_num++;
    if (instr.comp_type != Instruction::CompType::COMP_TYPE_INTEGER)
        return;
    state.op_lifo.push_back(state.memory.Create(Type::ARRAY));
    Array& a = state.op_lifo.back()->GetData<Array>();
    for (unsigned int i = (unsigned int)instr.comp_value.v_integer, sz = state.GetArgsCount(); i < sz; i++)
        a[i] = state.GetArg(i);
}